

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

Pafs * kj::anon_unknown_0::makeCompletionCountingPafs
                 (Pafs *__return_storage_ptr__,uint count,uint *tasksCompleted)

{
  long lVar1;
  SourceLocation location;
  ReducePromises<void> RVar2;
  void *pvVar3;
  int iVar4;
  undefined4 in_register_00000034;
  OwnPromiseNode location_00;
  Array<kj::Promise<void>_> *result;
  bool bVar5;
  PromiseBase local_e0;
  ArrayBuilder<kj::Promise<void>_> promisesBuilder;
  anon_class_8_1_78461c9b_for_func local_b0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  void *continuationTracePtr;
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> fulfillersBuilder;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  PromiseFulfillerPair<void> paf;
  
  promisesBuilder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::Promise<void>>(5);
  promisesBuilder.endPtr = promisesBuilder.ptr + 5;
  promisesBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  promisesBuilder.pos = promisesBuilder.ptr;
  fulfillersBuilder.ptr =
       kj::_::HeapArrayDisposer::
       allocateUninitialized<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>(5);
  fulfillersBuilder.endPtr = fulfillersBuilder.ptr + 5;
  fulfillersBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  iVar4 = 5;
  fulfillersBuilder.pos = fulfillersBuilder.ptr;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_58 = "makeCompletionCountingPafs";
    local_50 = 0x1000000345;
    location.function = (char *)local_a8.ptr;
    location.fileName = (char *)local_b0.tasksCompleted;
    location._16_8_ = continuationTracePtr;
    newPromiseAndFulfiller<void>(location);
    RVar2 = paf.promise;
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:838:42)>
         ::anon_class_8_1_78461c9b_for_func::operator();
    lVar1 = *(long *)((long)paf.promise.super_PromiseBase.node.ptr + 8);
    local_b0.tasksCompleted = (uint *)CONCAT44(in_register_00000034,count);
    if (lVar1 == 0 || (ulong)((long)paf.promise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
      pvVar3 = operator_new(0x400);
      location_00.ptr = (PromiseNode *)((long)pvVar3 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::makeCompletionCountingPafs(unsigned_int,unsigned_int&)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::makeCompletionCountingPafs(unsigned_int,unsigned_int&)::__0,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:838:42)>
                  *)location_00.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,
                 &local_b0,&continuationTracePtr);
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      *(undefined8 *)((long)paf.promise.super_PromiseBase.node.ptr + 8) = 0;
      location_00.ptr = (PromiseNode *)((long)paf.promise.super_PromiseBase.node.ptr + -0x28);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::makeCompletionCountingPafs(unsigned_int,unsigned_int&)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::makeCompletionCountingPafs(unsigned_int,unsigned_int&)::__0,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:838:42)>
                  *)location_00.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,
                 &local_b0,&continuationTracePtr);
      *(long *)((long)RVar2.super_PromiseBase.node.ptr + -0x20) = lVar1;
    }
    local_a8.ptr = (PromiseNode *)0x0;
    local_68.ptr = (PromiseNode *)0x0;
    local_e0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)location_00.ptr;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    ((promisesBuilder.pos)->super_PromiseBase).node.ptr = (PromiseNode *)local_e0.node.ptr;
    local_e0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    promisesBuilder.pos = promisesBuilder.pos + 1;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0.node);
    (fulfillersBuilder.pos)->disposer = paf.fulfiller.disposer;
    (fulfillersBuilder.pos)->ptr = paf.fulfiller.ptr;
    paf.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    fulfillersBuilder.pos = fulfillersBuilder.pos + 1;
    PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  }
  (__return_storage_ptr__->promises).ptr = promisesBuilder.ptr;
  (__return_storage_ptr__->promises).size_ =
       (long)promisesBuilder.pos - (long)promisesBuilder.ptr >> 3;
  (__return_storage_ptr__->promises).disposer = promisesBuilder.disposer;
  promisesBuilder.ptr = (Promise<void> *)0x0;
  promisesBuilder.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
  promisesBuilder.endPtr = (Promise<void> *)0x0;
  (__return_storage_ptr__->fulfillers).ptr = fulfillersBuilder.ptr;
  (__return_storage_ptr__->fulfillers).size_ =
       (long)fulfillersBuilder.pos - (long)fulfillersBuilder.ptr >> 4;
  (__return_storage_ptr__->fulfillers).disposer = fulfillersBuilder.disposer;
  fulfillersBuilder.ptr = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0;
  fulfillersBuilder.pos = (RemoveConst<kj::Own<kj::PromiseFulfiller<void>_>_> *)0x0;
  fulfillersBuilder.endPtr = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0;
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::dispose(&fulfillersBuilder);
  ArrayBuilder<kj::Promise<void>_>::dispose(&promisesBuilder);
  return __return_storage_ptr__;
}

Assistant:

Pafs makeCompletionCountingPafs(uint count, uint& tasksCompleted) {
  auto promisesBuilder = heapArrayBuilder<Promise<void>>(count);
  auto fulfillersBuilder = heapArrayBuilder<Own<PromiseFulfiller<void>>>(count);

  for (auto KJ_UNUSED value: zeroTo(count)) {
    auto paf = newPromiseAndFulfiller<void>();
    promisesBuilder.add(paf.promise.then([&tasksCompleted]() {
      ++tasksCompleted;
    }));
    fulfillersBuilder.add(kj::mv(paf.fulfiller));
  }

  return { promisesBuilder.finish(), fulfillersBuilder.finish() };
}